

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::IsWithinBounds
          (LoopDependenceAnalysis *this,int64_t value,int64_t bound_one,int64_t bound_two)

{
  bool local_32;
  bool local_31;
  int64_t bound_two_local;
  int64_t bound_one_local;
  int64_t value_local;
  LoopDependenceAnalysis *this_local;
  
  if (bound_one < bound_two) {
    local_31 = bound_one <= value && value <= bound_two;
    this_local._7_1_ = local_31;
  }
  else if (bound_two < bound_one) {
    local_32 = bound_two <= value && value <= bound_one;
    this_local._7_1_ = local_32;
  }
  else {
    this_local._7_1_ = value == bound_one;
  }
  return this_local._7_1_;
}

Assistant:

bool LoopDependenceAnalysis::IsWithinBounds(int64_t value, int64_t bound_one,
                                            int64_t bound_two) {
  if (bound_one < bound_two) {
    // If |bound_one| is the lower bound.
    return (value >= bound_one && value <= bound_two);
  } else if (bound_one > bound_two) {
    // If |bound_two| is the lower bound.
    return (value >= bound_two && value <= bound_one);
  } else {
    // Both bounds have the same value.
    return value == bound_one;
  }
}